

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirBLOCK(void)

{
  bool bVar1;
  int iVar2;
  aint val;
  aint teller;
  aint local_10;
  int local_c;
  
  local_10 = 0;
  iVar2 = ParseExpressionNoSyntaxError(&lp,&local_c);
  if (iVar2 == 0) {
    Error("[BLOCK] Syntax Error in <length>",lp,SUPPRESS);
  }
  else {
    if (local_c < 0) {
      Warning("Negative BLOCK?",(char *)0x0,W_PASS3);
    }
    bVar1 = comma(&lp);
    if (bVar1) {
      iVar2 = ParseExpression(&lp,&local_10);
      if (iVar2 != 0) {
        check8(local_10);
      }
    }
    EmitBlock(local_10,local_c,false,4);
  }
  return;
}

Assistant:

static void dirBLOCK() {
	aint teller,val = 0;
	if (ParseExpressionNoSyntaxError(lp, teller)) {
		if (teller < 0) {
			Warning("Negative BLOCK?");
		}
		if (comma(lp)) {
			if (ParseExpression(lp, val)) check8(val);
		}
		EmitBlock(val, teller);
	} else {
		Error("[BLOCK] Syntax Error in <length>", lp, SUPPRESS);
	}
}